

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pla.h
# Opt level: O0

int Pla_ManLitInNum(Pla_Man_t *p)

{
  int iVar1;
  word *p_00;
  undefined4 local_28;
  int Count;
  int Lit;
  int k;
  int i;
  word *pCube;
  Pla_Man_t *p_local;
  
  local_28 = 0;
  for (Lit = 0; iVar1 = Pla_ManCubeNum(p), Lit < iVar1; Lit = Lit + 1) {
    p_00 = Pla_CubeIn(p,Lit);
    for (Count = 0; iVar1 = Pla_ManInNum(p), Count < iVar1; Count = Count + 1) {
      iVar1 = Pla_CubeGetLit(p_00,Count);
      local_28 = (uint)(iVar1 != 0) + local_28;
    }
  }
  return local_28;
}

Assistant:

static inline int Pla_ManLitInNum( Pla_Man_t * p )
{
    word * pCube; int i, k, Lit, Count = 0;
    Pla_ForEachCubeIn( p, pCube, i )
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            Count += Lit != PLA_LIT_DASH;
    return Count;
}